

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall MutableS2ShapeIndex::ApplyUpdatesThreadSafe(MutableS2ShapeIndex *this)

{
  int *piVar1;
  __int_type_conflict _Var2;
  UpdateState *this_00;
  pointer __p;
  S2LogMessage local_20;
  
  do {
    LOCK();
    _Var2 = (this->lock_).locked_._M_base._M_i;
    (this->lock_).locked_._M_base._M_i = true;
    UNLOCK();
  } while ((_Var2 & 1U) != 0);
  if ((this->index_status_)._M_i == FRESH) {
    (this->lock_).locked_._M_base._M_i = false;
    return;
  }
  if ((this->index_status_)._M_i == UPDATING) {
    this_00 = (this->update_state_)._M_t.
              super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
              ._M_t.
              super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
              .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl;
    piVar1 = &this_00->num_waiting;
    *piVar1 = *piVar1 + 1;
    (this->lock_).locked_._M_base._M_i = false;
    std::mutex::lock((mutex *)this_00);
    do {
      LOCK();
      _Var2 = (this->lock_).locked_._M_base._M_i;
      (this->lock_).locked_._M_base._M_i = true;
      UNLOCK();
    } while ((_Var2 & 1U) != 0);
    piVar1 = &((this->update_state_)._M_t.
               super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               ._M_t.
               super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
               .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl)->
              num_waiting;
    *piVar1 = *piVar1 + -1;
  }
  else {
    if ((this->index_status_)._M_i != STALE) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                 ,0x1d9,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_20.stream_,"Check failed: (STALE) == (index_status_) ");
      abort();
    }
    (this->index_status_)._M_i = UPDATING;
    __p = (pointer)operator_new(0x30);
    (__p->wait_mutex).mutex_.super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(__p->wait_mutex).mutex_.super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(__p->wait_mutex).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
    (__p->wait_mutex).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)
     ((long)&(__p->wait_mutex).mutex_.super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
    *(undefined8 *)
     ((long)&(__p->wait_mutex).mutex_.super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
    std::
    __uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
    ::reset((__uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
             *)&this->update_state_,__p);
    std::mutex::lock((mutex *)(this->update_state_)._M_t.
                              super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
                              .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>.
                              _M_head_impl);
    (this->lock_).locked_._M_base._M_i = false;
    ApplyUpdatesInternal(this);
    do {
      LOCK();
      _Var2 = (this->lock_).locked_._M_base._M_i;
      (this->lock_).locked_._M_base._M_i = true;
      UNLOCK();
    } while ((_Var2 & 1U) != 0);
    (this->index_status_)._M_i = FRESH;
  }
  UnlockAndSignal(this);
  return;
}

Assistant:

void MutableS2ShapeIndex::ApplyUpdatesThreadSafe() {
  lock_.Lock();
  if (index_status_.load(std::memory_order_relaxed) == FRESH) {
    lock_.Unlock();
  } else if (index_status_.load(std::memory_order_relaxed) == UPDATING) {
    // Wait until the updating thread is finished.  We do this by attempting
    // to lock a mutex that is held by the updating thread.  When this mutex
    // is unlocked the index_status_ is guaranteed to be FRESH.
    ++update_state_->num_waiting;
    lock_.Unlock();
    update_state_->wait_mutex.Lock();
    lock_.Lock();
    --update_state_->num_waiting;
    UnlockAndSignal();  // Notify other waiting threads.
  } else {
    S2_DCHECK_EQ(STALE, index_status_);
    index_status_.store(UPDATING, std::memory_order_relaxed);
    // Allocate the extra state needed for thread synchronization.  We keep
    // the spinlock held while doing this, because (1) memory allocation is
    // fast, so the chance of a context switch while holding the lock is low;
    // (2) by far the most common situation is that there is no contention,
    // and this saves an extra lock and unlock step; (3) even in the rare case
    // where there is contention, the main side effect is that some other
    // thread will burn a few CPU cycles rather than sleeping.
    update_state_.reset(new UpdateState);
    // lock_.Lock wait_mutex *before* calling Unlock() to ensure that all other
    // threads will block on it.
    update_state_->wait_mutex.Lock();
    // Release the spinlock before doing any real work.
    lock_.Unlock();
    ApplyUpdatesInternal();
    lock_.Lock();
    // index_status_ can be updated to FRESH only while locked *and* using
    // an atomic store operation, so that MaybeApplyUpdates() can check
    // whether the index is FRESH without acquiring the spinlock.
    index_status_.store(FRESH, std::memory_order_release);
    UnlockAndSignal();  // Notify any waiting threads.
  }
}